

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::Release
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this)

{
  ReferenceCounterValueType RVar1;
  RenderDeviceBase<Diligent::EngineGLImplTraits> *this_local;
  
  RVar1 = RefCountedObject<Diligent::IRenderDeviceGL>::Release
                    ((RefCountedObject<Diligent::IRenderDeviceGL> *)this);
  return RVar1;
}

Assistant:

Release() override final
    {
        return TObjectBase::Release();
    }